

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.h
# Opt level: O3

void __thiscall snmalloc::LocalEntropy::init<snmalloc::PALLinux>(LocalEntropy *this)

{
  bool bVar1;
  uint64_t uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = PALLinux::get_entropy64();
  this->local_key = uVar2;
  uVar2 = PALLinux::get_entropy64();
  uVar3 = uVar2 + 1;
  this->local_counter = uVar3;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    uVar3 = ((uVar3 & 0xfffffffff) * this->local_key ^ uVar3) >> 0x20 | uVar3 << 0x20;
    bVar1 = false;
  } while (bVar4);
  this->bit_source = uVar3;
  return;
}

Assistant:

void init()
    {
      local_key = get_entropy64<PAL>();
      local_counter = get_entropy64<PAL>();
      bit_source = get_next();
    }